

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall embree::BVH8Factory::BVH8QuantizedTriangle4i(BVH8Factory *this,Scene *scene)

{
  BVHN<8> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  Intersectors intersectors;
  Intersectors local_138;
  
  this_00 = (BVHN<8> *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN(this_00,(PrimitiveType *)&TriangleMi<4>::type,scene);
  local_138.collider.name = (char *)0x0;
  local_138.intersector1.intersect = (IntersectFunc)0x0;
  local_138.leafIntersector = (void *)0x0;
  local_138.collider.collide = (CollideFunc)0x0;
  local_138.intersector1.occluded = (OccludedFunc)0x0;
  memset(&local_138.intersector1.name,0,0xe0);
  local_138.ptr = (AccelData *)this_00;
  (*this->QBVH8Triangle4iIntersector1Pluecker)(&local_138.intersector1);
  builder = (*this->BVH8QuantizedTriangle4iSceneBuilderSAH)(this_00,scene,0);
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&local_138);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8QuantizedTriangle4i(Scene* scene)
  {
    BVH8* accel = new BVH8(Triangle4i::type,scene);
    Accel::Intersectors intersectors = QBVH8Triangle4iIntersectors(accel);
    Builder* builder = BVH8QuantizedTriangle4iSceneBuilderSAH(accel,scene,0);
    return new AccelInstance(accel,builder,intersectors);
  }